

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-take.c
# Opt level: O0

_Bool borg_flow_take_scum(_Bool viewable,wchar_t nearness)

{
  byte bVar1;
  byte bVar2;
  _Bool _Var3;
  wchar_t wVar4;
  loc grid2;
  borg_take *pbVar5;
  borg_take *take;
  borg_grid *ag;
  wchar_t b_stair;
  wchar_t b_j;
  wchar_t j;
  wchar_t y;
  wchar_t x;
  wchar_t i;
  wchar_t nearness_local;
  _Bool viewable_local;
  
  ag._4_4_ = L'\xffffffff';
  ag._0_4_ = L'\xffffffff';
  if (borg_takes_cnt == 0) {
    i._3_1_ = false;
  }
  else if (borg_items[(int)(((uint)z_info->pack_size - borg.trait[0x9e]) + -1)].iqty == '\0') {
    borg_temp_n = 0;
    for (y = L'\0'; y < track_less.num; y = y + L'\x01') {
      grid2 = loc(track_less.x[y],track_less.y[y]);
      wVar4 = distance(borg.c,grid2);
      if (ag._4_4_ < wVar4) {
        ag._0_4_ = y;
        ag._4_4_ = wVar4;
      }
    }
    for (y = L'\x01'; y < borg_takes_nxt; y = y + L'\x01') {
      pbVar5 = borg_takes + y;
      if (pbVar5->kind != (object_kind *)0x0) {
        bVar1 = pbVar5->x;
        bVar2 = pbVar5->y;
        if ((L'\0' < pbVar5->value) &&
           (((!viewable || ((borg_grids[(int)(uint)bVar2][(int)(uint)bVar1].info & 0x20) != 0)) &&
            (_Var3 = borg_flow_far_from_stairs((uint)bVar1,(uint)bVar2,(wchar_t)ag), !_Var3)))) {
          borg_temp_x[borg_temp_n] = bVar1;
          borg_temp_y[borg_temp_n] = bVar2;
          borg_temp_n = borg_temp_n + 1;
        }
      }
    }
    if (borg_temp_n == 0) {
      i._3_1_ = false;
    }
    else {
      borg_flow_clear();
      for (y = L'\0'; y < borg_temp_n; y = y + L'\x01') {
        borg_flow_enqueue_grid((uint)borg_temp_y[y],(uint)borg_temp_x[y]);
      }
      borg_flow_spread(nearness,true,(_Bool)((viewable ^ 0xffU) & 1),false,L'\xffffffff',true);
      _Var3 = borg_flow_commit("Scum item",L'\x02');
      if (_Var3) {
        _Var3 = borg_flow_old(L'\x02');
        if (_Var3) {
          i._3_1_ = true;
        }
        else {
          i._3_1_ = false;
        }
      }
      else {
        i._3_1_ = false;
      }
    }
  }
  else {
    i._3_1_ = false;
  }
  return i._3_1_;
}

Assistant:

bool borg_flow_take_scum(bool viewable, int nearness)
{
    int i, x, y;
    int j;
    int b_j     = -1;
    int b_stair = -1;

    borg_grid *ag;

    /* Efficiency -- Nothing to take */
    if (!borg_takes_cnt)
        return false;

    /* Require one empty slot */
    if (borg_items[PACK_SLOTS - 1].iqty)
        return false;

    /* Nothing yet */
    borg_temp_n = 0;

    /* Check distance away from stairs, used later */

    /* Check for an existing "up stairs" */
    for (i = 0; i < track_less.num; i++) {
        x = track_less.x[i];
        y = track_less.y[i];

        /* How far is the nearest up stairs */
        j = distance(borg.c, loc(x, y));

        /* skip the closer ones */
        if (b_j >= j)
            continue;

        /* track it */
        b_j     = j;
        b_stair = i;
    }

    /* Scan the object list -- set filter*/
    for (i = 1; i < borg_takes_nxt; i++) {
        borg_take *take = &borg_takes[i];

        /* Skip dead objects */
        if (!take->kind)
            continue;

        /* Access the location */
        x = take->x;
        y = take->y;

        /* Get the grid */
        ag = &borg_grids[y][x];

        /* skip worthless items */
        if (take->value <= 0)
            continue;

        /* Require line of sight if requested */
        if (viewable && !(ag->info & BORG_VIEW))
            continue;

        /* don't go too far from the stairs */
        if (borg_flow_far_from_stairs(x, y, b_stair))
            continue;

        /* Careful -- Remember it */
        borg_temp_x[borg_temp_n] = x;
        borg_temp_y[borg_temp_n] = y;
        borg_temp_n++;
    }

    /* Nothing to take */
    if (!borg_temp_n)
        return false;

    /* Clear the flow codes */
    borg_flow_clear();

    /* Look for something to take */
    for (i = 0; i < borg_temp_n; i++) {
        /* Enqueue the grid */
        borg_flow_enqueue_grid(borg_temp_y[i], borg_temp_x[i]);
    }

    /* Spread the flow */
    /* if we are not flowing toward items that we can see, make sure they */
    /* are at least easily reachable.  The second flag is weather or not  */
    /* to avoid unknown squares.  This was for performance. */
    borg_flow_spread(nearness, true, !viewable, false, -1, true);

    /* Attempt to Commit the flow */
    if (!borg_flow_commit("Scum item", GOAL_TAKE))
        return false;

    /* Take one step */
    if (!borg_flow_old(GOAL_TAKE))
        return false;

    /* Success */
    return true;
}